

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O3

bool __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::removeObject
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this,
          function<bool_(const_std::shared_ptr<helics::Core>_&)> *operand)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  const_iterator __position;
  iterator __position_00;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  __position._M_node =
       (_Base_ptr)(this->objectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->objectMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      if ((operand->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar2 = (*operand->_M_invoker)
                        ((_Any_data *)operand,(shared_ptr<helics::Core> *)(__position._M_node + 2));
      if (bVar2) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>_>
        ::_M_erase_aux(&(this->objectMap)._M_t,__position);
        __position_00 =
             std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
             ::find(&(this->typeMap)._M_t,__position._M_node + 1);
        bVar2 = true;
        if ((_Rb_tree_header *)__position_00._M_node !=
            &(this->typeMap)._M_t._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
          ::_M_erase_aux(&(this->typeMap)._M_t,(const_iterator)__position_00._M_node);
        }
        goto LAB_00297ab2;
      }
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    } while ((_Rb_tree_header *)__position._M_node != p_Var1);
  }
  bVar2 = false;
LAB_00297ab2:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar2;
}

Assistant:

bool removeObject(std::function<bool(const std::shared_ptr<X>&)> operand)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        for (auto obj = objectMap.begin(); obj != objectMap.end(); ++obj) {
            if (operand(obj->second)) {
                objectMap.erase(obj);
                auto fnd2 = typeMap.find(obj->first);
                if (fnd2 != typeMap.end()) {
                    typeMap.erase(fnd2);
                }
                return true;
            }
        }
        return false;
    }